

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  long lVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  int iVar6;
  undefined1 **ppuVar7;
  size_t sVar8;
  undefined1 **ppuVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  digit_grouping<char> grouping;
  undefined1 local_e7 [2];
  undefined4 local_e5;
  undefined1 local_e0 [4];
  undefined1 local_dc [12];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_d0;
  int local_c4;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  float_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_dc._0_4_ = f->significand;
  uVar10 = 0x1f;
  if ((local_dc._0_4_ | 1) != 0) {
    for (; (local_dc._0_4_ | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar11 = (ulong)(uint)local_dc._0_4_ +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar10 * 8);
  local_e0 = SUB84(uVar11 >> 0x20,0);
  local_e5._0_1_ = '0';
  local_e7[1] = fspecs._5_1_;
  local_78 = fspecs;
  if (-1 < (long)uVar11) {
    lVar18 = ((uVar11 >> 0x20) + 1) - (ulong)(local_e7[1] == none);
    cVar1 = '.';
    uVar10 = fspecs._4_4_;
    local_d0 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    if ((uVar10 >> 0x11 & 1) != 0) {
      local_dc._4_8_ = f;
      if (loc.locale_ == (void *)0x0) {
        std::locale::locale((locale *)local_c0);
      }
      else {
        std::locale::locale((locale *)local_c0,(locale *)loc.locale_);
      }
      pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_c0);
      cVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
      std::locale::~locale((locale *)local_c0);
      f = (decimal_fp<float> *)local_dc._4_8_;
    }
    uVar12 = local_b0._M_allocated_capacity;
    uVar14 = ((format_specs<char> *)f)->precision;
    iVar16 = (int)local_e0 + uVar14;
    iVar6 = fspecs.precision;
    local_e7[0] = cVar1;
    if (fspecs._4_1_ == '\x01') {
LAB_0018c437:
      iVar15 = uVar14 + (int)local_e0 + -1;
      if ((uVar10 >> 0x13 & 1) == 0) {
        uVar11 = 0;
        if (local_e0 == (undefined1  [4])0x1) {
          local_e7[0] = '\0';
          uVar11 = 0;
        }
      }
      else {
        uVar11 = 0;
        if (0 < iVar6 - (int)local_e0) {
          uVar11 = (ulong)(uint)(iVar6 - (int)local_e0);
        }
        lVar18 = lVar18 + uVar11;
      }
      local_c0[0] = local_e7[1];
      local_c0._4_4_ = local_dc._0_4_;
      local_c0[0xc] = local_e7[0];
      local_c0._8_4_ = local_e0;
      local_b0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar11);
      local_b0._M_allocated_capacity._6_2_ = SUB82(uVar12,6);
      local_b0._M_allocated_capacity =
           CONCAT26(local_b0._M_allocated_capacity._6_2_,
                    CONCAT15(((uVar10 >> 0x10 & 1) == 0) << 5,local_b0._M_allocated_capacity._0_5_))
           | 0x450000000000;
      local_b0._8_4_ = iVar15;
      if (0 < specs->width) {
        if (iVar16 < 1) {
          iVar15 = 1 - iVar16;
        }
        lVar3 = 2;
        if (99 < iVar15) {
          lVar3 = (ulong)(999 < iVar15) + 3;
        }
        sVar8 = lVar18 + (3 - (ulong)(local_e7[0] == '\0')) + lVar3;
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          ((appender)local_d0.container,specs,sVar8,sVar8,
                           (anon_class_28_8_ad0ecca5 *)local_c0);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar5 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_28_8_ad0ecca5::operator()
                        ((anon_class_28_8_ad0ecca5 *)local_c0,(iterator)local_d0.container);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar15 = 0x10;
      if (0 < iVar6) {
        iVar15 = iVar6;
      }
      if ((iVar16 < -3) || (iVar15 < iVar16)) goto LAB_0018c437;
    }
    local_c4 = iVar16;
    if ((int)uVar14 < 0) {
      if (iVar16 < 1) {
        iVar17 = -iVar16;
        iVar15 = iVar17;
        if (SBORROW4(iVar6,iVar17) != iVar6 + iVar16 < 0) {
          iVar15 = iVar6;
        }
        if (iVar6 < 0) {
          iVar15 = iVar17;
        }
        if (local_e0 != (undefined1  [4])0x0) {
          iVar15 = iVar17;
        }
        local_70._M_allocated_capacity._0_4_ = iVar15;
        if (local_e0 == (undefined1  [4])0x0 && iVar15 == 0) {
          local_e5._1_1_ = (char)((uVar10 & 0x80000) >> 0x13);
          iVar6 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_e5._1_1_ = 1;
          iVar6 = 2;
          if (iVar15 < 0) goto LAB_0018c721;
        }
        sVar8 = lVar18 + (ulong)(uint)(iVar6 + iVar15);
        local_c0._0_8_ = local_e7 + 1;
        local_c0._8_8_ = local_e7 + 2;
        local_b0._M_allocated_capacity = (size_type)(local_e7 + 3);
        local_b0._8_8_ = local_e7;
        local_a0._M_p = (pointer)&local_70;
        local_98 = (float_specs *)(local_e7 + 0xb);
        local_90._M_allocated_capacity = (size_type)(local_e7 + 7);
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          ((appender)local_d0.container,specs,sVar8,sVar8,
                           (anon_class_56_7_162c6e41 *)local_c0);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      iVar15 = 0;
      register0x000000a0 = iVar6 - (int)local_e0 & (int)(uVar10 << 0xc) >> 0x1f;
      uVar14 = register0x000000a0;
      if ((int)register0x000000a0 < 1) {
        uVar14 = 0;
      }
      local_dc._4_8_ = specs;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar10 >> 0x11) & 1));
      if (local_98 != (float_specs *)0x0) {
        ppuVar7 = (undefined1 **)(local_c0._8_8_ + local_c0._0_8_);
        lVar3 = 0;
        ppuVar9 = (undefined1 **)local_c0._0_8_;
        do {
          if (ppuVar9 == ppuVar7) {
            cVar1 = *(char *)((long)ppuVar7 + -1);
            ppuVar9 = ppuVar7;
          }
          else {
            cVar1 = *(char *)ppuVar9;
            if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_0018c745;
            ppuVar9 = (undefined1 **)((long)ppuVar9 + 1);
          }
          iVar15 = iVar15 + cVar1;
          if (iVar16 <= iVar15) goto LAB_0018c745;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      lVar3 = 0;
LAB_0018c745:
      sVar8 = (ulong)uVar14 + lVar18 + lVar3 + 1;
      local_70._M_allocated_capacity = (size_type)(local_e7 + 1);
      local_70._8_8_ = local_e7 + 0xb;
      local_60 = local_e7 + 7;
      local_58 = &local_c4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e7;
      local_40._M_allocated_capacity = (size_type)(local_e7 + 3);
      local_40._8_8_ = local_e7 + 2;
      local_48 = (digit_grouping<char> *)local_c0;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (local_d0.container,(format_specs<char> *)local_dc._4_8_,sVar8,sVar8,
                      (anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,(ulong)(local_90._M_allocated_capacity + 1));
      }
      uVar12 = local_b0._M_allocated_capacity;
      uVar13 = local_c0._0_8_;
      if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
        return (appender)bVar4.container;
      }
    }
    else {
      lVar18 = lVar18 + (ulong)uVar14;
      register0x000000a0 = iVar6 - iVar16;
      if ((uVar10 >> 0x13 & 1) != 0) {
        lVar18 = lVar18 + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)register0x000000a0) {
          if (0 < (int)register0x000000a0) {
            lVar18 = lVar18 + (ulong)(uint)register0x000000a0;
          }
        }
        else {
          stack0xffffffffffffff1c = 0;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar10 >> 0x11) & 1));
      iVar6 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        ppuVar9 = (undefined1 **)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar3 = 0;
        uVar12 = local_70._M_allocated_capacity;
        do {
          if ((undefined1 **)uVar12 == ppuVar9) {
            cVar1 = *(char *)((long)ppuVar9 + -1);
            uVar12 = ppuVar9;
          }
          else {
            cVar1 = *(char *)uVar12;
            if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_0018c642;
            uVar12 = (undefined1 **)(uVar12 + 1);
          }
          iVar6 = iVar6 + cVar1;
          if (iVar16 <= iVar6) goto LAB_0018c642;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      lVar3 = 0;
LAB_0018c642:
      local_c0._0_8_ = local_e7 + 1;
      local_c0._8_8_ = local_e7 + 0xb;
      local_b0._M_allocated_capacity = (size_type)(local_e7 + 7);
      local_98 = &local_78;
      local_90._M_allocated_capacity = (size_type)local_e7;
      local_90._8_8_ = local_e7 + 3;
      local_80 = local_e7 + 2;
      local_b0._8_8_ = f;
      local_a0._M_p = (pointer)&local_70;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (local_d0.container,specs,lVar18 + lVar3,lVar18 + lVar3,
                      (anon_class_72_9_0c6a3a8a *)local_c0);
      if (local_50 != &local_40) {
        operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
      }
      uVar12 = local_60;
      uVar13 = local_70._M_allocated_capacity;
      if ((undefined1 **)local_70._M_allocated_capacity == &local_60) {
        return (appender)bVar4.container;
      }
    }
    operator_delete((void *)uVar13,(ulong)(uVar12 + 1));
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
  }
LAB_0018c721:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
              ,0x189,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}